

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ConstantValue::convertToInt(ConstantValue *this)

{
  bool bVar1;
  string *this_00;
  ConstantValue *in_RDI;
  bitwidth_t bits;
  bool in_stack_000000f2;
  bool in_stack_000000f3;
  bitwidth_t in_stack_000000f4;
  ConstantValue *in_stack_000000f8;
  ConstantValue *in_stack_ffffffffffffffc8;
  ConstantValue *this_01;
  
  this_01 = in_RDI;
  bVar1 = isReal((ConstantValue *)0x66b39a);
  if (bVar1) {
    convertToInt(in_stack_000000f8,in_stack_000000f4,in_stack_000000f3,in_stack_000000f2);
  }
  else {
    bVar1 = isShortReal((ConstantValue *)0x66b3cb);
    if (bVar1) {
      convertToInt(in_stack_000000f8,in_stack_000000f4,in_stack_000000f3,in_stack_000000f2);
    }
    else {
      bVar1 = isString((ConstantValue *)0x66b3fc);
      if (bVar1) {
        this_00 = str_abi_cxx11_((ConstantValue *)0x66b40c);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                  (this_00);
        convertToInt(in_stack_000000f8,in_stack_000000f4,in_stack_000000f3,in_stack_000000f2);
      }
      else {
        bVar1 = isInteger((ConstantValue *)0x66b450);
        if (bVar1) {
          ConstantValue(this_01,in_stack_ffffffffffffffc8);
        }
        else {
          ConstantValue(this_01,in_stack_ffffffffffffffc8);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

ConstantValue ConstantValue::convertToInt() const {
    if (isReal())
        return convertToInt(64, true, false);
    if (isShortReal())
        return convertToInt(32, true, false);
    if (isString()) {
        bitwidth_t bits = bitwidth_t(str().length() * 8);
        if (!bits)
            bits = 8;

        return convertToInt(bits, false, false);
    }
    if (!isInteger())
        return nullptr;

    return *this;
}